

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O0

int gost_cipher_ctl(EVP_CIPHER_CTX *ctx,int type,int arg,void *ptr)

{
  undefined4 uVar1;
  int iVar2;
  int iVar3;
  char *__s2;
  long lVar4;
  char *in_RCX;
  ossl_gost_cipher_ctx *c_00;
  undefined4 in_EDX;
  int in_ESI;
  undefined8 in_RDI;
  ossl_gost_cipher_ctx *c_1;
  int ret;
  int cur_meshing;
  int nid_1;
  ossl_gost_cipher_ctx *c;
  int nid;
  char *params;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  undefined8 in_stack_ffffffffffffffa0;
  undefined4 local_2c;
  int local_4;
  
  c_00 = (ossl_gost_cipher_ctx *)(ulong)(in_ESI - 6);
  switch(c_00) {
  case (ossl_gost_cipher_ctx *)0x0:
    uVar1 = EVP_CIPHER_CTX_get_key_length(in_RDI);
    iVar2 = RAND_priv_bytes(in_RCX,uVar1);
    if (iVar2 < 1) {
      ERR_GOST_error((int)((ulong)in_RCX >> 0x20),(int)in_RCX,
                     (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
      local_4 = -1;
    }
    else {
      local_4 = 1;
    }
    break;
  case (ossl_gost_cipher_ctx *)0x1:
    if (in_RCX == (char *)0x0) {
      local_4 = 0;
    }
    else {
      __s2 = get_gost_engine_param(in_stack_ffffffffffffff9c);
      local_2c = 0x3dd;
      if (__s2 != (char *)0x0) {
        iVar2 = strcmp("md_gost12_256",__s2);
        if (iVar2 == 0) {
          local_2c = 0x3dc;
        }
        else {
          iVar2 = strcmp("md_gost12_512",__s2);
          if (iVar2 == 0) {
            local_2c = 0x3dd;
          }
          else {
            iVar2 = strcmp("md_gost94",__s2);
            if (iVar2 == 0) {
              local_2c = 0x32a;
            }
          }
        }
      }
      *(undefined4 *)in_RCX = local_2c;
      local_4 = 1;
    }
    break;
  default:
    ERR_GOST_error((int)((ulong)in_stack_ffffffffffffffa0 >> 0x20),(int)in_stack_ffffffffffffffa0,
                   (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
    local_4 = -1;
    break;
  case (ossl_gost_cipher_ctx *)0x18:
    if (in_RCX == (char *)0x0) {
      local_4 = 0;
    }
    else {
      lVar4 = EVP_CIPHER_CTX_get_cipher_data(in_RDI);
      iVar2 = (int)((ulong)in_stack_ffffffffffffffa0 >> 0x20);
      if (lVar4 == 0) {
        local_4 = -1;
      }
      else if (*(int *)(lVar4 + 4) == 0) {
        iVar3 = OBJ_txt2nid(in_RCX);
        if (iVar3 == 0) {
          local_4 = 0;
        }
        else {
          uVar1 = *(undefined4 *)(lVar4 + 8);
          local_4 = gost_cipher_set_param(c_00,iVar2);
          *(undefined4 *)(lVar4 + 8) = uVar1;
        }
      }
      else {
        local_4 = -1;
      }
    }
    break;
  case (ossl_gost_cipher_ctx *)0x1a:
    lVar4 = EVP_CIPHER_CTX_get_cipher_data(in_RDI);
    if (lVar4 == 0) {
      local_4 = -1;
    }
    else if (*(int *)(lVar4 + 4) == 0) {
      *(undefined4 *)(lVar4 + 8) = in_EDX;
      local_4 = 1;
    }
    else {
      local_4 = -1;
    }
  }
  return local_4;
}

Assistant:

static int gost_cipher_ctl(EVP_CIPHER_CTX *ctx, int type, int arg, void *ptr)
{
    switch (type) {
    case EVP_CTRL_RAND_KEY:
        {
            if (RAND_priv_bytes
                ((unsigned char *)ptr, EVP_CIPHER_CTX_key_length(ctx)) <= 0) {
                GOSTerr(GOST_F_GOST_CIPHER_CTL, GOST_R_RNG_ERROR);
                return -1;
            }
            break;
        }
    case EVP_CTRL_PBE_PRF_NID:
        if (ptr) {
            const char *params = get_gost_engine_param(GOST_PARAM_PBE_PARAMS);
            int nid = NID_id_tc26_hmac_gost_3411_2012_512;

            if (params) {
                if (!strcmp("md_gost12_256", params))
                    nid = NID_id_tc26_hmac_gost_3411_2012_256;
                else if (!strcmp("md_gost12_512", params))
                    nid = NID_id_tc26_hmac_gost_3411_2012_512;
                else if (!strcmp("md_gost94", params))
                    nid = NID_id_HMACGostR3411_94;
            }
            *((int *)ptr) = nid;
            return 1;
        } else {
            return 0;
        }

    case EVP_CTRL_SET_SBOX:
        if (ptr) {
            struct ossl_gost_cipher_ctx *c =
                EVP_CIPHER_CTX_get_cipher_data(ctx);
            int nid;
            int cur_meshing;
            int ret;

            if (c == NULL) {
                return -1;
            }

            if (c->count != 0) {
                return -1;
            }

            nid = OBJ_txt2nid(ptr);
            if (nid == NID_undef) {
                return 0;
            }

            cur_meshing = c->key_meshing;
            ret = gost_cipher_set_param(c, nid);
            c->key_meshing = cur_meshing;
            return ret;
        } else {
            return 0;
        }
    case EVP_CTRL_KEY_MESH:
        {
            struct ossl_gost_cipher_ctx *c =
                EVP_CIPHER_CTX_get_cipher_data(ctx);

            if (c == NULL) {
                return -1;
            }

            if (c->count != 0) {
                return -1;
            }

            c->key_meshing = arg;
            return 1;
        }
    default:
        GOSTerr(GOST_F_GOST_CIPHER_CTL, GOST_R_UNSUPPORTED_CIPHER_CTL_COMMAND);
        return -1;
    }
    return 1;
}